

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  Size SVar4;
  uint *puVar5;
  Clause *pCVar6;
  char *pcVar7;
  vec<unsigned_int,_int> *this_00;
  vec<unsigned_int,_int> *cs;
  int j;
  int i;
  SimpSolver *this_local;
  
  if (this->n_touched != 0) {
    cs._0_4_ = 0;
    _j = this;
    for (cs._4_4_ = 0; iVar1 = cs._4_4_, iVar2 = Queue<unsigned_int>::size(&this->subsumption_queue)
        , iVar1 < iVar2; cs._4_4_ = cs._4_4_ + 1) {
      puVar5 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
      pCVar6 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar5);
      uVar3 = Clause::mark(pCVar6);
      if (uVar3 == 0) {
        puVar5 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
        pCVar6 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar5);
        Clause::mark(pCVar6,2);
      }
    }
    for (cs._4_4_ = 0; iVar1 = cs._4_4_, iVar2 = Solver::nVars(&this->super_Solver), iVar1 < iVar2;
        cs._4_4_ = cs._4_4_ + 1) {
      pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          cs._4_4_);
      if (*pcVar7 != '\0') {
        this_00 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                  ::lookup(&this->occurs,(int *)((long)&cs + 4));
        for (cs._0_4_ = 0; iVar1 = (int)cs, SVar4 = vec<unsigned_int,_int>::size(this_00),
            iVar1 < SVar4; cs._0_4_ = (int)cs + 1) {
          puVar5 = vec<unsigned_int,_int>::operator[](this_00,(int)cs);
          pCVar6 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar5);
          uVar3 = Clause::mark(pCVar6);
          if (uVar3 == 0) {
            puVar5 = vec<unsigned_int,_int>::operator[](this_00,(int)cs);
            Queue<unsigned_int>::insert(&this->subsumption_queue,*puVar5);
            puVar5 = vec<unsigned_int,_int>::operator[](this_00,(int)cs);
            pCVar6 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar5);
            Clause::mark(pCVar6,2);
          }
        }
        pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                            cs._4_4_);
        *pcVar7 = '\0';
      }
    }
    for (cs._4_4_ = 0; iVar1 = cs._4_4_, iVar2 = Queue<unsigned_int>::size(&this->subsumption_queue)
        , iVar1 < iVar2; cs._4_4_ = cs._4_4_ + 1) {
      puVar5 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
      pCVar6 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar5);
      uVar3 = Clause::mark(pCVar6);
      if (uVar3 == 2) {
        puVar5 = Queue<unsigned_int>::operator[](&this->subsumption_queue,cs._4_4_);
        pCVar6 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar5);
        Clause::mark(pCVar6,0);
      }
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < nVars(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}